

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       map_caster<std::unordered_map<long,std::vector<long,std::allocator<long>>,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>>,long,std::vector<long,std::allocator<long>>>
       ::
       cast<std::unordered_map<long,std::vector<long,std::allocator<long>>,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,std::vector<long,std::allocator<long>>>>>const&>
                 (SequenceDistanceGraph *src,return_value_policy policy,handle parent)

{
  handle hVar1;
  pointer *ppvVar2;
  dict d;
  object key;
  object value;
  handle local_68;
  handle local_60;
  object local_58;
  item_accessor local_50;
  
  dict::dict((dict *)&local_68);
  ppvVar2 = &(src->super_DistanceGraph).links.
             super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  do {
    hVar1.m_ptr = local_68.m_ptr;
    ppvVar2 = (pointer *)*ppvVar2;
    if (ppvVar2 == (pointer *)0x0) {
      local_68.m_ptr = (PyObject *)0x0;
LAB_00207ef8:
      object::~object((object *)&local_68);
      return (handle)hVar1.m_ptr;
    }
    local_60.m_ptr = (PyObject *)PyLong_FromSsize_t((pointer)ppvVar2[1]);
    local_58.super_handle =
         list_caster<std::vector<long,std::allocator<long>>,long>::
         cast<std::vector<long,std::allocator<long>>const&>
                   ((vector<long,_std::allocator<long>_> *)(ppvVar2 + 2),policy,parent);
    if ((local_60.m_ptr == (PyObject *)0x0) || (local_58.super_handle.m_ptr == (PyObject *)0x0)) {
      object::~object(&local_58);
      object::~object((object *)&local_60);
      hVar1.m_ptr = (PyObject *)0x0;
      goto LAB_00207ef8;
    }
    object_api<pybind11::handle>::operator[]
              (&local_50,(object_api<pybind11::handle> *)&local_68,local_60);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_50,&local_58);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_50);
    object::~object(&local_58);
    object::~object((object *)&local_60);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        dict d;
        return_value_policy policy_key = policy;
        return_value_policy policy_value = policy;
        if (!std::is_lvalue_reference<T>::value) {
            policy_key = return_value_policy_override<Key>::policy(policy_key);
            policy_value = return_value_policy_override<Value>::policy(policy_value);
        }
        for (auto &&kv : src) {
            auto key = reinterpret_steal<object>(key_conv::cast(forward_like<T>(kv.first), policy_key, parent));
            auto value = reinterpret_steal<object>(value_conv::cast(forward_like<T>(kv.second), policy_value, parent));
            if (!key || !value)
                return handle();
            d[key] = value;
        }
        return d.release();
    }